

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::NotImplementedException::NotImplementedException
          (NotImplementedException *this,SourceLineInfo *lineInfo)

{
  size_type sVar1;
  ostream *poVar2;
  ostringstream oss;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__NotImplementedException_001b4b58;
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  (this->m_what)._M_string_length = 0;
  (this->m_what).field_2._M_local_buf[0] = '\0';
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,lineInfo);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(lineInfo->file)._M_dataplus._M_p,
                      (lineInfo->file)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"function ",9);
  sVar1 = (lineInfo->function)._M_string_length;
  if (sVar1 != 0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(lineInfo->function)._M_dataplus._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"not implemented",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_what,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

NotImplementedException::NotImplementedException( const SourceLineInfo& lineInfo )
    :   m_lineInfo( lineInfo ) {
        std::ostringstream oss;
        oss << lineInfo << "function ";
        if( !lineInfo.function.empty() )
            oss << lineInfo.function << " ";
        oss << "not implemented";
        m_what = oss.str();
    }